

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.h
# Opt level: O2

int pstack::Procman::threadListCb<pstack::Procman::Process::getStacks[abi:cxx11]()::__1>
              (td_thrhandle_t *thr,void *v)

{
  Process *p;
  list<pstack::Procman::ThreadStack,_std::allocator<pstack::Procman::ThreadStack>_> *this;
  int iVar1;
  value_type local_2a0;
  undefined1 local_108 [8];
  CoreRegisters regs;
  
  p = *v;
  iVar1 = td_thr_getgregs();
  if (iVar1 == 0) {
    this = *(list<pstack::Procman::ThreadStack,_std::allocator<pstack::Procman::ThreadStack>_> **)
            ((long)v + 8);
    memset(&local_2a0,0,0x198);
    std::__cxx11::list<pstack::Procman::ThreadStack,_std::allocator<pstack::Procman::ThreadStack>_>
    ::push_back(this,&local_2a0);
    std::_Vector_base<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>::
    ~_Vector_base(&local_2a0.stack.
                   super__Vector_base<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>
                 );
    td_thr_get_info(thr,*(long *)(*(long *)((long)v + 8) + 8) + 0x10);
    ThreadStack::unwind((ThreadStack *)(*(long *)(*(long *)((long)v + 8) + 8) + 0x10),p,
                        (CoreRegisters *)local_108);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              (*(_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> **)
                ((long)v + 0x10),(int *)(*(long *)(*(long *)((long)v + 8) + 8) + 0x78));
  }
  return 0;
}

Assistant:

int
threadListCb(const td_thrhandle_t *thr, void *v)
{ T &callback = *(T *)v; callback(thr); return 0; }